

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstddebug.cpp
# Opt level: O3

SQRESULT sqstd_register_debuglib(HSQUIRRELVM v)

{
  SQInteger nparamscheck;
  long lVar1;
  char *s;
  
  s = "seterrorhandler";
  lVar1 = 0x20;
  do {
    sq_pushstring(v,s,-1);
    nparamscheck = *(SQInteger *)((long)&PTR_typeinfo_001a5370 + lVar1);
    sq_newclosure(v,*(SQFUNCTION *)((long)&PTR_typeinfo_name_001a5368 + lVar1),0);
    sq_setparamscheck(v,nparamscheck,*(SQChar **)(&UNK_001a5378 + lVar1));
    sq_setnativeclosurename(v,-1,s);
    sq_newslot(v,-3,0);
    s = *(char **)((long)&debuglib_funcs[0].name + lVar1);
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x100);
  return 0;
}

Assistant:

SQRESULT sqstd_register_debuglib(HSQUIRRELVM v)
{
  SQInteger i = 0;
  while (debuglib_funcs[i].name != 0)
  {
    sq_pushstring(v, debuglib_funcs[i].name, -1);
    sq_newclosure(v, debuglib_funcs[i].f, 0);
    sq_setparamscheck(v, debuglib_funcs[i].nparamscheck, debuglib_funcs[i].typemask);
    sq_setnativeclosurename(v, -1, debuglib_funcs[i].name);
    sq_newslot(v, -3, SQFalse);
    i++;
  }
  return SQ_OK;
}